

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3.h
# Opt level: O0

void ncnn::convdw3x3s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float sum;
  int remain;
  int i;
  float *k2;
  float *k1;
  float *k0;
  float *r2;
  float *r1;
  float *r0;
  float *img0;
  float *outptr;
  float *kernel0;
  float bias0;
  Mat out;
  int g;
  float *bias;
  float *kernel;
  int tailstep;
  int group;
  int outh;
  int outw;
  int w;
  float local_158;
  int local_150;
  int local_14c;
  float *in_stack_fffffffffffffec0;
  int _c;
  Mat *in_stack_fffffffffffffec8;
  float *local_130;
  float *local_128;
  float *local_120;
  Mat local_118;
  float *local_d0;
  float *local_b8;
  Mat *local_b0;
  float local_a4;
  Mat local_a0;
  int local_54;
  float *local_50;
  float *local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  
  local_2c = *(int *)(in_RDI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x2c);
  local_34 = *(int *)(in_RSI + 0x30);
  local_38 = *(int *)(in_RDI + 0x38);
  local_3c = local_2c * 2 + local_30 * -2;
  local_20 = in_RCX;
  local_48 = Mat::operator_cast_to_float_(in_RDX);
  local_50 = Mat::operator_cast_to_float_(local_20);
  for (local_54 = 0; _c = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20), local_54 < local_38;
      local_54 = local_54 + 1) {
    Mat::channel(in_stack_fffffffffffffec8,_c);
    if (local_50 == (float *)0x0) {
      local_158 = 0.0;
    }
    else {
      local_158 = local_50[local_54];
    }
    local_a4 = local_158;
    local_b0 = (Mat *)(local_48 + local_54 * 9);
    local_b8 = Mat::operator_cast_to_float_(&local_a0);
    Mat::channel(in_stack_fffffffffffffec8,_c);
    pfVar1 = Mat::operator_cast_to_float_(&local_118);
    Mat::~Mat((Mat *)0x692d38);
    local_128 = pfVar1 + local_2c;
    local_130 = pfVar1 + (local_2c << 1);
    in_stack_fffffffffffffec0 = (float *)((long)&local_b0->refcount + 4);
    local_120 = pfVar1;
    for (local_14c = 0; local_14c < local_34; local_14c = local_14c + 1) {
      for (local_150 = local_30; 0 < local_150; local_150 = local_150 + -1) {
        *local_b8 = local_130[2] * *(float *)&local_b0->allocator +
                    local_130[1] * *(float *)&local_b0->field_0x1c +
                    *local_130 * (float)local_b0->elempack +
                    local_128[2] * *(float *)((long)&local_b0->elemsize + 4) +
                    local_128[1] * *(float *)&local_b0->elemsize +
                    *local_128 * *in_stack_fffffffffffffec0 +
                    local_120[2] * *(float *)&local_b0->refcount +
                    local_120[1] * *(float *)((long)&local_b0->data + 4) +
                    *local_120 * *(float *)&local_b0->data + local_a4;
        local_120 = local_120 + 2;
        local_128 = local_128 + 2;
        local_130 = local_130 + 2;
        local_b8 = local_b8 + 1;
      }
      local_120 = local_120 + local_3c;
      local_128 = local_128 + local_3c;
      local_130 = local_130 + local_3c;
    }
    in_stack_fffffffffffffec8 = local_b0;
    local_d0 = pfVar1;
    Mat::~Mat((Mat *)0x69301e);
  }
  return;
}

Assistant:

static void convdw3x3s2_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = w - 2 * outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        const float bias0 = bias ? bias[g] : 0.f;

        const float* kernel0 = kernel + g * 9;

        float* outptr = out;

        const float* img0 = bottom_blob.channel(g);

        const float* r0 = img0;
        const float* r1 = img0 + w;
        const float* r2 = img0 + w * 2;

        const float* k0 = kernel0;
        const float* k1 = kernel0 + 3;
        const float* k2 = kernel0 + 6;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                *outptr = sum;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}